

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

void __thiscall re2::Regexp::~Regexp(Regexp *this)

{
  uint8 uVar1;
  undefined8 *puVar2;
  LogMessage LStack_188;
  
  if (this->nsub_ != 0) {
    LogMessage::LogMessage
              (&LStack_188,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.cc",0x22
               ,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&LStack_188.str_,"Regexp not destroyed.",0x15);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_188);
  }
  uVar1 = this->op_;
  if (uVar1 == '\x04') {
    if ((this->field_7).the_union_[1] != (void *)0x0) {
      operator_delete__((this->field_7).the_union_[1]);
    }
  }
  else {
    if (uVar1 == '\x14') {
      if ((this->field_7).the_union_[0] != (void *)0x0) {
        operator_delete__((this->field_7).the_union_[0]);
      }
      puVar2 = (undefined8 *)(this->field_7).the_union_[1];
      if (puVar2 != (undefined8 *)0x0) {
        std::
        _Rb_tree<re2::RuneRange,_re2::RuneRange,_std::_Identity<re2::RuneRange>,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
        ::~_Rb_tree((_Rb_tree<re2::RuneRange,_re2::RuneRange,_std::_Identity<re2::RuneRange>,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
                     *)(puVar2 + 2));
      }
    }
    else {
      if (uVar1 != '\v') {
        return;
      }
      puVar2 = (undefined8 *)(this->field_7).the_union_[1];
      if ((puVar2 != (undefined8 *)0x0) && ((undefined8 *)*puVar2 != puVar2 + 2)) {
        operator_delete((undefined8 *)*puVar2);
      }
    }
    operator_delete(puVar2);
  }
  return;
}

Assistant:

Regexp::~Regexp() {
  if (nsub_ > 0)
    LOG(DFATAL) << "Regexp not destroyed.";

  switch (op_) {
    default:
      break;
    case kRegexpCapture:
      delete name_;
      break;
    case kRegexpLiteralString:
      delete[] runes_;
      break;
    case kRegexpCharClass:
      if (cc_)
        cc_->Delete();
      delete ccb_;
      break;
  }
}